

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O1

Result * CoreML::validateTensorMessage
                   (Result *__return_storage_ptr__,Tensor *tensor,NeuralNetworkLayer *layer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32 uVar2;
  string *psVar3;
  pointer pcVar4;
  undefined8 *puVar5;
  long *plVar6;
  long *plVar7;
  string err;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  uVar2 = (tensor->dimvalue_).current_size_;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if ((int)uVar2 < 1) {
LAB_002add20:
    Result::Result(__return_storage_ptr__);
  }
  else {
    if (tensor->rank_ == uVar2) {
      if (0 < (int)tensor->rank_) goto LAB_002add20;
      psVar3 = (layer->name_).ptr_;
      local_90[0] = local_80;
      pcVar4 = (psVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar4,pcVar4 + psVar3->_M_string_length);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x35c32b);
      local_b0 = &local_a0;
      plVar6 = puVar5 + 2;
      if ((long *)*puVar5 == plVar6) {
        local_a0 = *plVar6;
        lStack_98 = puVar5[3];
      }
      else {
        local_a0 = *plVar6;
        local_b0 = (long *)*puVar5;
      }
      local_a8 = puVar5[1];
      *puVar5 = plVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    }
    else {
      psVar3 = (layer->name_).ptr_;
      local_90[0] = local_80;
      pcVar4 = (psVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar4,pcVar4 + psVar3->_M_string_length);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x35c32b);
      local_b0 = &local_a0;
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_a0 = *plVar7;
        lStack_98 = plVar6[3];
      }
      else {
        local_a0 = *plVar7;
        local_b0 = (long *)*plVar6;
      }
      local_a8 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    }
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar6[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar6;
    }
    local_68 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateTensorMessage(const Specification::Tensor& tensor, const Specification::NeuralNetworkLayer& layer) {
    std::string err;
    int rank = static_cast<int>(tensor.rank());
    if (tensor.dimvalue_size() > 0) {
        if (rank != tensor.dimvalue_size()) {
            err = "Tensor in layer '" + std::string(layer.name()) + "': rank must match the length of dimValue";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (rank < 1) {
            err = "Tensor in layer '" + std::string(layer.name()) + "': rank must be positive";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}